

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subcommand_a.cpp
# Opt level: O2

void setup_subcommand_a(App *app)

{
  element_type *peVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  App *this;
  Option *pOVar3;
  allocator local_119;
  __shared_ptr<SubcommandAOptions,_(__gnu_cxx::_Lock_policy)2> local_118;
  shared_ptr<SubcommandAOptions> opt;
  _Any_data local_f8;
  code *local_e8;
  code *pcStack_e0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  string local_30;
  
  CLI::std::make_shared<SubcommandAOptions>();
  std::__cxx11::string::string((string *)&local_30,"subcommand_a",(allocator *)&local_118);
  std::__cxx11::string::string((string *)&local_50,"performs subcommand a",&local_119);
  this = CLI::App::add_subcommand(app,&local_30,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string((string *)&local_70,"-f,--file",(allocator *)&local_118);
  peVar1 = opt.super___shared_ptr<SubcommandAOptions,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string((string *)&local_90,"File name",&local_119);
  pOVar3 = CLI::App::
           add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                     (this,&local_70,&peVar1->file,&local_90);
  (pOVar3->super_OptionBase<CLI::Option>).required_ = true;
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::string((string *)&local_b0,"--with-foo",(allocator *)&local_118);
  std::__cxx11::string::string((string *)&local_d0,"Counter",&local_119);
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>
            (this,&local_b0,
             &(opt.super___shared_ptr<SubcommandAOptions,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              with_foo,&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_b0);
  CLI::std::__shared_ptr<SubcommandAOptions,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_118,&opt.super___shared_ptr<SubcommandAOptions,_(__gnu_cxx::_Lock_policy)2>);
  local_e8 = (code *)0x0;
  pcStack_e0 = (code *)0x0;
  local_f8._M_unused._M_object = (void *)0x0;
  local_f8._8_8_ = 0;
  local_f8._M_unused._M_object = operator_new(0x10);
  _Var2._M_pi = local_118._M_refcount._M_pi;
  peVar1 = local_118._M_ptr;
  local_118._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_118._M_ptr = (element_type *)0x0;
  *(element_type **)local_f8._M_unused._0_8_ = peVar1;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_f8._M_unused._0_8_ + 8) =
       _Var2._M_pi;
  pcStack_e0 = CLI::std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/examples/subcom_in_files/subcommand_a.cpp:21:23)>
               ::_M_invoke;
  local_e8 = CLI::std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/examples/subcom_in_files/subcommand_a.cpp:21:23)>
             ::_M_manager;
  CLI::std::function<void_()>::operator=(&this->callback_,(function<void_()> *)&local_f8);
  CLI::std::_Function_base::~_Function_base((_Function_base *)&local_f8);
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_118._M_refcount);
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&opt.super___shared_ptr<SubcommandAOptions,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

void setup_subcommand_a(CLI::App &app) {
    // Create the option and subcommand objects.
    auto opt = std::make_shared<SubcommandAOptions>();
    auto sub = app.add_subcommand("subcommand_a", "performs subcommand a");

    // Add options to sub, binding them to opt.
    sub->add_option("-f,--file", opt->file, "File name")->required();
    sub->add_flag("--with-foo", opt->with_foo, "Counter");

    // Set the run function as callback to be called when this subcommand is issued.
    sub->set_callback([opt]() { run_subcommand_a(*opt); });
}